

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O3

void av1_cdef_fb_row(AV1_COMMON *cm,MACROBLOCKD *xd,uint16_t **linebuf,uint16_t **colbuf,
                    uint16_t *src,int fbr,cdef_init_fb_row_t cdef_init_fb_row_fn,
                    AV1CdefSyncData *cdef_sync,aom_internal_error_info *error_info)

{
  _Bool _Var1;
  uint8_t uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int mi_row;
  int iVar6;
  int iVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  uint8_t *puVar15;
  uint16_t *puVar16;
  int fbc;
  int iVar17;
  int mi_col;
  int *piVar18;
  int local_b28;
  int cdef_left [3];
  CdefBlockInfo fb_info;
  
  cdef_left[0] = 1;
  cdef_left[1] = 1;
  cdef_left[2] = 1;
  iVar6 = (cm->mi_params).mi_cols;
  iVar17 = iVar6 + 0x1e;
  if (-1 < iVar6 + 0xf) {
    iVar17 = iVar6 + 0xf;
  }
  (*cdef_init_fb_row_fn)(cm,xd,&fb_info,linebuf,src,cdef_sync,fbr);
  if ((cdef_sync == (AV1CdefSyncData *)0x0) || ((cm->cdef_info).allocated_num_workers < 2)) {
    if (iVar6 < 1) {
      return;
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)cdef_sync->mutex_);
    _Var1 = cdef_sync->cdef_mt_exit;
    pthread_mutex_unlock((pthread_mutex_t *)cdef_sync->mutex_);
    if (iVar6 < 1 || _Var1 != false) {
      return;
    }
  }
  iVar17 = iVar17 >> 4;
  mi_row = fbr * 0x10;
  iVar6 = 1;
  if (1 < iVar17) {
    iVar6 = iVar17;
  }
  fbc = 0;
  do {
    fb_info.frame_boundary[1] = (int)(fbc == 0);
    if (fbc == iVar17 + -1) {
      fb_info.frame_boundary[3] = 1;
      mi_col = fbc << 4;
    }
    else {
      mi_col = fbc * 0x10;
      fb_info.frame_boundary[3] = (int)(mi_col + 0x10 == (cm->mi_params).mi_cols);
    }
    uVar3 = (int)(short)(*(short *)&(cm->mi_params).mi_grid_base
                                    [(cm->mi_params).mi_stride * mi_row + mi_col]->field_0xa7 * 2) &
            0xff000;
    uVar2 = cm->seq_params->monochrome;
    uVar10 = (uint)(uVar2 == '\0') * 2 + 1;
    if (uVar3 == 0xff000) {
LAB_00390627:
      memset(cdef_left,0,(ulong)(uVar10 * 4));
    }
    else {
      iVar7 = (int)(uVar3 << 0xc) >> 0x18;
      uVar3 = (cm->cdef_info).cdef_strengths[iVar7];
      uVar9 = uVar3;
      if ((int)uVar3 < 0) {
        uVar9 = uVar3 + 3;
      }
      iVar5 = (int)uVar3 % 4;
      if ((int)uVar3 % 4 == 3) {
        iVar5 = 4;
      }
      if (uVar2 == '\0') {
        uVar4 = (cm->cdef_info).cdef_uv_strengths[iVar7];
        uVar14 = uVar4;
        if ((int)uVar4 < 0) {
          uVar14 = uVar4 + 3;
        }
        local_b28 = (int)uVar14 >> 2;
        iVar7 = (int)uVar4 % 4;
        if ((int)uVar4 % 4 == 3) {
          iVar7 = 4;
        }
        bVar13 = iVar7 == 0 && uVar4 + 3 < 7;
      }
      else {
        local_b28 = 0;
        bVar13 = true;
        iVar7 = 0;
      }
      if ((uVar3 + 3 < 7 && iVar5 == 0) && bVar13) goto LAB_00390627;
      fb_info.cdef_count =
           av1_cdef_compute_sb_list(&cm->mi_params,mi_row,mi_col,fb_info.dlist,BLOCK_64X64);
      if (fb_info.cdef_count == 0) goto LAB_00390627;
      piVar11 = cdef_left;
      uVar12 = 0;
      piVar18 = &xd->plane[0].subsampling_x;
      do {
        if (uVar12 == 0) {
          fb_info.dst = xd->plane[0].dst.buf;
          fb_info.dst_stride = xd->plane[0].dst.stride;
          fb_info.xdec = xd->plane[0].subsampling_x;
          fb_info.ydec = xd->plane[0].subsampling_y;
          fb_info.mi_wide_l2 = 2 - fb_info.xdec;
          fb_info.mi_high_l2 = 2 - fb_info.ydec;
          fb_info.roffset = mi_row << ((byte)fb_info.mi_high_l2 & 0x1f);
          fb_info.coffset = mi_col << ((byte)fb_info.mi_wide_l2 & 0x1f);
          fb_info.level = (int)uVar9 >> 2;
          fb_info.sec_strength = iVar5;
          cdef_prepare_fb(cm,&fb_info,colbuf,cdef_left[0],fbc,fbr,0);
          puVar15 = fb_info.dst +
                    (long)fb_info.coffset + (long)fb_info.roffset * (long)fb_info.dst_stride;
          if (cm->seq_params->use_highbitdepth == '\0') {
            puVar16 = (uint16_t *)0x0;
          }
          else {
            puVar16 = (uint16_t *)((long)puVar15 * 2);
            puVar15 = (uint8_t *)0x0;
          }
          av1_cdef_filter_fb(puVar15,puVar16,fb_info.dst_stride,fb_info.src + 0x128,fb_info.xdec,
                             fb_info.ydec,fb_info.dir,(int *)0x0,fb_info.var,0,fb_info.dlist,
                             fb_info.cdef_count,fb_info.level,fb_info.sec_strength,fb_info.damping,
                             fb_info.coeff_shift);
          piVar8 = cdef_left;
LAB_003905f9:
          *piVar8 = 1;
        }
        else {
          if (!bVar13) {
            fb_info.level = local_b28;
            fb_info.sec_strength = iVar7;
            fb_info.dst = ((buf_2d *)(piVar18 + 3))->buf;
            fb_info.dst_stride = piVar18[9];
            fb_info.xdec = *piVar18;
            fb_info.ydec = piVar18[1];
            fb_info.mi_wide_l2 = 2 - *piVar18;
            fb_info.mi_high_l2 = 2 - piVar18[1];
            fb_info.roffset = mi_row << ((byte)fb_info.mi_high_l2 & 0x1f);
            fb_info.coffset = mi_col << ((byte)fb_info.mi_wide_l2 & 0x1f);
            cdef_prepare_fb(cm,&fb_info,colbuf,*piVar11,fbc,fbr,(int)uVar12);
            puVar15 = fb_info.dst +
                      (long)fb_info.coffset + (long)fb_info.roffset * (long)fb_info.dst_stride;
            if (cm->seq_params->use_highbitdepth == '\0') {
              puVar16 = (uint16_t *)0x0;
            }
            else {
              puVar16 = (uint16_t *)((long)puVar15 * 2);
              puVar15 = (uint8_t *)0x0;
            }
            av1_cdef_filter_fb(puVar15,puVar16,fb_info.dst_stride,fb_info.src + 0x128,fb_info.xdec,
                               fb_info.ydec,fb_info.dir,(int *)0x0,fb_info.var,(int)uVar12,
                               fb_info.dlist,fb_info.cdef_count,fb_info.level,fb_info.sec_strength,
                               fb_info.damping,fb_info.coeff_shift);
            piVar8 = piVar11;
            goto LAB_003905f9;
          }
          *piVar11 = 0;
        }
        uVar12 = uVar12 + 1;
        piVar11 = piVar11 + 1;
        piVar18 = piVar18 + 0x28c;
      } while (uVar10 != uVar12);
    }
    fbc = fbc + 1;
    if (fbc == iVar6) {
      return;
    }
  } while( true );
}

Assistant:

void av1_cdef_fb_row(const AV1_COMMON *const cm, MACROBLOCKD *xd,
                     uint16_t **const linebuf, uint16_t **const colbuf,
                     uint16_t *const src, int fbr,
                     cdef_init_fb_row_t cdef_init_fb_row_fn,
                     struct AV1CdefSyncData *const cdef_sync,
                     struct aom_internal_error_info *error_info) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  CdefBlockInfo fb_info;
  int cdef_left[MAX_MB_PLANE] = { 1, 1, 1 };
  const int nhfb = (cm->mi_params.mi_cols + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  cdef_init_fb_row_fn(cm, xd, &fb_info, linebuf, src, cdef_sync, fbr);
#if CONFIG_MULTITHREAD
  if (cdef_sync && cm->cdef_info.allocated_num_workers > 1) {
    pthread_mutex_lock(cdef_sync->mutex_);
    const bool cdef_mt_exit = cdef_sync->cdef_mt_exit;
    pthread_mutex_unlock(cdef_sync->mutex_);
    // Exit in case any worker has encountered an error.
    if (cdef_mt_exit) return;
  }
#endif
  for (int fbc = 0; fbc < nhfb; fbc++) {
    fb_info.frame_boundary[LEFT] = (MI_SIZE_64X64 * fbc == 0) ? 1 : 0;
    if (fbc != nhfb - 1)
      fb_info.frame_boundary[RIGHT] =
          (MI_SIZE_64X64 * (fbc + 1) == cm->mi_params.mi_cols) ? 1 : 0;
    else
      fb_info.frame_boundary[RIGHT] = 1;
    cdef_fb_col(cm, xd, &fb_info, colbuf, &cdef_left[0], fbc, fbr);
  }
}